

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GetStringField
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)field;
  field_local = (FieldDef *)struct_def;
  struct_def_local = (StructDef *)this;
  GenReceiver(this,struct_def,code_ptr);
  IdlNamer::Function_abi_cxx11_(&local_70,&this->namer_,(Definition *)code_ptr_local);
  std::operator+(&local_50," ",&local_70);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  TypeName_abi_cxx11_(&local_e0,this,(FieldDef *)code_ptr_local);
  std::operator+(&local_c0,"() ",&local_e0);
  std::operator+(&local_a0,&local_c0," ");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  OffsetPrefix_abi_cxx11_(&local_140,this,(FieldDef *)code_ptr_local);
  std::operator+(&local_120,&local_140,"\t\treturn ");
  GenGetter_abi_cxx11_(&local_160,this,(Type *)&code_ptr_local[6]._M_string_length);
  std::operator+(&local_100,&local_120,&local_160);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::operator+=((string *)local_30,"(o + rcv._tab.Pos)\n\t}\n\treturn nil\n");
  std::__cxx11::string::operator+=((string *)local_30,"}\n\n");
  return;
}

Assistant:

void GetStringField(const StructDef &struct_def, const FieldDef &field,
                      std::string *code_ptr) {
    std::string &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "() " + TypeName(field) + " ";
    code += OffsetPrefix(field) + "\t\treturn " + GenGetter(field.value.type);
    code += "(o + rcv._tab.Pos)\n\t}\n\treturn nil\n";
    code += "}\n\n";
  }